

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_umax64_arm(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  ulong local_58;
  uint64_t dd;
  uint64_t bb;
  uint64_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (aa = 0; (long)aa < oprsz_00; aa = aa + 8) {
    local_58 = *(ulong *)((long)b + aa);
    if (local_58 < *(ulong *)((long)a + aa)) {
      local_58 = *(ulong *)((long)a + aa);
    }
    *(ulong *)((long)d + aa) = local_58;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_umax64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        uint64_t aa = *(uint64_t *)((char *)a + i);
        uint64_t bb = *(uint64_t *)((char *)b + i);
        uint64_t dd = aa > bb ? aa : bb;
        *(uint64_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}